

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalBase<int>::ExtractNodeAndLocalNames
          (SignalBase<int> *this,string *LocalName,string *NodeName)

{
  string fullname;
  string local_38 [32];
  
  std::__cxx11::string::string((string *)&fullname,(string *)&this->name);
  std::__cxx11::string::rfind((char *)&fullname,0x124d58);
  std::__cxx11::string::substr((ulong)local_38,(ulong)&fullname);
  std::__cxx11::string::operator=((string *)LocalName,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::find((char *)&fullname,0x12432d);
  std::__cxx11::string::find((char *)&fullname,0x124328);
  std::__cxx11::string::substr((ulong)local_38,(ulong)&fullname);
  std::__cxx11::string::operator=((string *)NodeName,local_38);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&fullname);
  return;
}

Assistant:

virtual void ExtractNodeAndLocalNames(std::string &LocalName,
                                        std::string &NodeName) const {
    std::string fullname = this->getName();

    size_t IdxPosLocalName = fullname.rfind(":");
    LocalName = fullname.substr(IdxPosLocalName + 1,
                                fullname.length() - IdxPosLocalName + 1);
    size_t IdxPosNodeNameStart = fullname.find("(");
    size_t IdxPosNodeNameEnd = fullname.find(")");
    NodeName = fullname.substr(IdxPosNodeNameStart + 1,
                               IdxPosNodeNameEnd - IdxPosNodeNameStart - 1);
  }